

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void idx2::GrowCapacity<idx2::stref>(array<idx2::stref> *Array,i64 NewCapacity)

{
  byte *local_58;
  i64 iStack_50;
  allocator *local_48;
  buffer local_38;
  
  if (NewCapacity == 0) {
    NewCapacity = (*(long *)(Array + 0x20) * 3) / 2 + 8;
  }
  if (*(long *)(Array + 0x20) < NewCapacity) {
    if (Mallocator()::Instance == '\0') {
      GrowCapacity<idx2::stref>();
    }
    local_58 = (byte *)0x0;
    iStack_50 = 0;
    local_48 = (allocator *)&Mallocator()::Instance;
    (**(code **)**(undefined8 **)(Array + 0x28))
              (*(undefined8 **)(Array + 0x28),&local_58,NewCapacity << 4);
    local_38.Alloc = local_48;
    local_38.Data = local_58;
    local_38.Bytes = iStack_50;
    MemCopy((buffer *)Array,&local_38);
    (**(code **)(**(long **)(Array + 0x28) + 8))(*(long **)(Array + 0x28),Array);
    *(allocator **)(Array + 0x10) = local_38.Alloc;
    *(byte **)Array = local_38.Data;
    *(i64 *)(Array + 8) = local_38.Bytes;
    *(i64 *)(Array + 0x20) = NewCapacity;
  }
  return;
}

Assistant:

void
GrowCapacity(array<t>* Array, i64 NewCapacity)
{
  if (NewCapacity == 0) // default
    NewCapacity = Array->Capacity * 3 / 2 + 8;
  if (Array->Capacity < NewCapacity)
  {
    buffer Buf;
    Array->Alloc->Alloc(&Buf, NewCapacity * sizeof(t));
    idx2_Assert(Buf);
    Relocate(Array, Buf);
    Array->Capacity = NewCapacity;
  }
}